

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_listener_set_header(nni_ws_listener *l,char *name,void *buf,size_t sz,nni_type t)

{
  int local_30;
  int rv;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  char *name_local;
  nni_ws_listener *l_local;
  
  local_30 = ws_check_string(buf,sz,t);
  if (local_30 == 0) {
    nni_mtx_lock(&l->mtx);
    local_30 = ws_set_header(&l->headers,name + 10,(char *)buf);
    nni_mtx_unlock(&l->mtx);
  }
  return local_30;
}

Assistant:

static int
ws_listener_set_header(nni_ws_listener *l, const char *name, const void *buf,
    size_t sz, nni_type t)
{
	int rv;
	name += strlen(NNG_OPT_WS_HEADER);
	if ((rv = ws_check_string(buf, sz, t)) == 0) {
		nni_mtx_lock(&l->mtx);
		rv = ws_set_header(&l->headers, name, buf);
		nni_mtx_unlock(&l->mtx);
	}
	return (rv);
}